

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

Vec4 __thiscall glcts::SetLum(glcts *this,Vec4 *cbase,Vec4 *clum)

{
  uint uVar1;
  undefined8 extraout_XMM0_Qa;
  uint uVar2;
  float fVar4;
  float fVar5;
  Vector<float,_4> VVar6;
  Vec4 VVar7;
  Vec4 vllum;
  Vec4 color;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  tcu local_58 [16];
  Vector<float,_4> local_48;
  tcu local_38 [16];
  Vec4 VVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar3 [16];
  
  fVar4 = clum->m_data[2] * 0.11 + clum->m_data[0] * 0.3 + clum->m_data[1] * 0.59;
  tcu::Vector<float,_4>::Vector
            (&local_78,
             fVar4 - (cbase->m_data[2] * 0.11 + cbase->m_data[0] * 0.3 + cbase->m_data[1] * 0.59));
  tcu::operator+((tcu *)&local_68,cbase,&local_78);
  tcu::Vector<float,_4>::Vector(&local_78,fVar4);
  fVar5 = (float)(~-(uint)(local_68.m_data[0] <= local_68.m_data[1]) & (uint)local_68.m_data[1] |
                 -(uint)(local_68.m_data[0] <= local_68.m_data[1]) & (uint)local_68.m_data[0]);
  uVar1 = -(uint)(fVar5 <= local_68.m_data[2]);
  if (0.0 <= (float)(~uVar1 & (uint)local_68.m_data[2] | uVar1 & (uint)fVar5)) {
    fVar5 = (float)(~-(uint)(local_68.m_data[1] <= local_68.m_data[0]) & (uint)local_68.m_data[1] |
                   (uint)local_68.m_data[0] & -(uint)(local_68.m_data[1] <= local_68.m_data[0]));
    uVar1 = -(uint)(local_68.m_data[2] <= fVar5);
    uVar2 = uVar1 & (uint)fVar5;
    auVar3 = ZEXT416(uVar2);
    if ((float)(~uVar1 & (uint)local_68.m_data[2] | uVar2) <= 1.0) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,&local_68);
      VVar8.m_data[0] = (float)(int)extraout_XMM0_Qa;
      auVar10._4_4_ = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
      register0x00001240 = (float)(int)auVar3._0_8_;
      register0x00001244 = (float)(int)((ulong)auVar3._0_8_ >> 0x20);
      return (Vec4)VVar8.m_data;
    }
    tcu::operator-(local_58,&local_68,&local_78);
    tcu::operator*((tcu *)&local_48,1.0 - fVar4,(Vector<float,_4> *)local_58);
    fVar5 = (float)(~-(uint)(local_68.m_data[1] <= local_68.m_data[0]) & (uint)local_68.m_data[1] |
                   (uint)local_68.m_data[0] & -(uint)(local_68.m_data[1] <= local_68.m_data[0]));
    uVar1 = -(uint)(local_68.m_data[2] <= fVar5);
    fVar4 = (float)(~uVar1 & (uint)local_68.m_data[2] | uVar1 & (uint)fVar5) - fVar4;
  }
  else {
    tcu::operator-(local_58,&local_68,&local_78);
    tcu::operator*((tcu *)&local_48,fVar4,(Vector<float,_4> *)local_58);
    fVar5 = (float)(~-(uint)(local_68.m_data[0] <= local_68.m_data[1]) & (uint)local_68.m_data[1] |
                   (uint)local_68.m_data[0] & -(uint)(local_68.m_data[0] <= local_68.m_data[1]));
    uVar1 = -(uint)(fVar5 <= local_68.m_data[2]);
    fVar4 = fVar4 - (float)(~uVar1 & (uint)local_68.m_data[2] | uVar1 & (uint)fVar5);
  }
  tcu::operator/(local_38,&local_48,fVar4);
  VVar6 = tcu::operator+((tcu *)this,&local_78,(Vector<float,_4> *)local_38);
  VVar7.m_data[0] = VVar6.m_data[0];
  auVar9._4_4_ = VVar6.m_data[1];
  register0x00001240 = VVar6.m_data[2];
  register0x00001244 = VVar6.m_data[3];
  return (Vec4)VVar7.m_data;
}

Assistant:

static tcu::Vec4 SetLum(const tcu::Vec4& cbase, const tcu::Vec4& clum)
{
	float	 lbase = Luminance(cbase);
	float	 llum  = Luminance(clum);
	float	 ldiff = llum - lbase;
	tcu::Vec4 color = cbase + tcu::Vec4(ldiff);
	tcu::Vec4 vllum = tcu::Vec4(llum);
	if (MinRGB(color) < 0.0f)
	{
		return vllum + ((color - vllum) * llum) / (llum - MinRGB(color));
	}
	else if (MaxRGB(color) > 1.0f)
	{
		return vllum + ((color - vllum) * (1.f - llum)) / (MaxRGB(color) - llum);
	}
	else
	{
		return color;
	}
}